

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<double,_QPointF>_>::relocate
          (QArrayDataPointer<std::pair<double,_QPointF>_> *this,qsizetype offset,
          pair<double,_QPointF> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<double,_QPointF>_> *in_RDI;
  pair<double,_QPointF> **unaff_retaddr;
  pair<double,_QPointF> *res;
  pair<double,_QPointF> *first;
  QArrayDataPointer<std::pair<double,_QPointF>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::pair<double,QPointF>,long_long>
            (first,(longlong)in_RDI,(pair<double,_QPointF> *)0xa66944);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<double,QPointF>>,std::pair<double,QPointF>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }